

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

bool __thiscall bloaty::RangeMap::CoversRange(RangeMap *this,uint64_t addr,uint64_t size)

{
  const_iterator iter;
  ulong uVar1;
  _Self __tmp;
  bool bVar2;
  
  iter = FindContaining(this,addr);
  uVar1 = size + addr;
  if (CARRY8(size,addr)) {
    __assert_fail("end >= addr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0x136,"bool bloaty::RangeMap::CoversRange(uint64_t, uint64_t) const");
  }
  while( true ) {
    bVar2 = uVar1 <= addr;
    if (bVar2) {
      return bVar2;
    }
    if ((_Rb_tree_header *)iter._M_node == &(this->mappings_)._M_t._M_impl.super__Rb_tree_header)
    break;
    bVar2 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (this,(_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                             )iter._M_node,addr);
    if (!bVar2) {
      return false;
    }
    addr = RangeEnd(this,iter);
    iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
  }
  return bVar2;
}

Assistant:

bool RangeMap::CoversRange(uint64_t addr, uint64_t size) const {
  auto it = FindContaining(addr);
  uint64_t end = addr + size;
  assert(end >= addr);

  while (true) {
    if (addr >= end) {
      return true;
    } else if (it == mappings_.end() || !EntryContains(it, addr)) {
      return false;
    }
    addr = RangeEnd(it);
    it++;
  }
}